

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O0

void Fx_ManStop(Fx_Man_t *p)

{
  Fx_Man_t *p_local;
  
  Vec_WecFree(p->vLits);
  Vec_IntFree(p->vCounts);
  Hsh_VecManStop(p->pHash);
  Vec_FltFree(p->vWeights);
  Vec_QueFree(p->vPrio);
  Vec_IntFree(p->vVarCube);
  Vec_IntFree(p->vLevels);
  Vec_IntFree(p->vCubesS);
  Vec_IntFree(p->vCubesD);
  Vec_IntFree(p->vCompls);
  Vec_IntFree(p->vCubeFree);
  Vec_IntFree(p->vDiv);
  if (p != (Fx_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Fx_ManStop( Fx_Man_t * p )
{
//    Vec_WecFree( p->vCubes );
    Vec_WecFree( p->vLits );
    Vec_IntFree( p->vCounts );
    Hsh_VecManStop( p->pHash );
    Vec_FltFree( p->vWeights );
    Vec_QueFree( p->vPrio );
    Vec_IntFree( p->vVarCube );
    Vec_IntFree( p->vLevels );
    // temporary data
    Vec_IntFree( p->vCubesS );
    Vec_IntFree( p->vCubesD );
    Vec_IntFree( p->vCompls );
    Vec_IntFree( p->vCubeFree );
    Vec_IntFree( p->vDiv );
    ABC_FREE( p );
}